

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext_api.h
# Opt level: O2

void __thiscall TestMetrics::TestMetrics(TestMetrics *this,int label,Metrics *metrics)

{
  pointer ppVar1;
  uint64_t uVar2;
  ulong uVar3;
  long lVar4;
  float *pfVar5;
  float *pfVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  
  uVar2 = metrics->predicted;
  this->gold = metrics->gold;
  this->predicted = uVar2;
  this->predictedGold = metrics->predictedGold;
  this->label = label;
  ppVar1 = (metrics->scoreVsTrue).
           super__Vector_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar3 = (long)(metrics->scoreVsTrue).
                super__Vector_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar1;
  uVar9 = uVar3 >> 3;
  iVar8 = (int)uVar9;
  this->scoresLen = iVar8;
  if (iVar8 == 0) {
    this->predictedScores = (float *)0x0;
    this->goldScores = (float *)0x0;
  }
  else {
    lVar4 = uVar3 * 0x20000000;
    uVar10 = lVar4 >> 0x1e;
    uVar3 = 0xffffffffffffffff;
    if (-1 < lVar4) {
      uVar3 = uVar10;
    }
    pfVar5 = (float *)operator_new__(uVar3);
    this->predictedScores = pfVar5;
    uVar7 = 0;
    uVar3 = uVar10 & 0xfffffffffffffffc;
    if (iVar8 < 0) {
      uVar3 = 0xffffffffffffffff;
    }
    uVar9 = uVar9 & 0xffffffff;
    if (iVar8 < 1) {
      uVar9 = uVar7;
    }
    pfVar6 = (float *)operator_new__(uVar3);
    this->goldScores = pfVar6;
    for (; uVar9 != uVar7; uVar7 = uVar7 + 1) {
      pfVar5[uVar7] = ppVar1[uVar7].first;
      pfVar6[uVar7] = ppVar1[uVar7].second;
    }
  }
  return;
}

Assistant:

explicit TestMetrics(int label, Meter::Metrics& metrics)
    {
        gold = metrics.gold;
        predicted = metrics.predicted;
        predictedGold = metrics.predictedGold;
        this->label = label;

        scoresLen = metrics.scoreVsTrue.size();

        if (scoresLen == 0)
        {
            predictedScores = nullptr;
            goldScores = nullptr;

            return;
        }

        predictedScores = new float[scoresLen];
        goldScores = new float[scoresLen];

        for (int i = 0; i<scoresLen; ++i) {
            predictedScores[i] = metrics.scoreVsTrue[i].first;
            goldScores[i] = metrics.scoreVsTrue[i].second;
        }
    }